

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_impl.hpp
# Opt level: O2

vertex_iterator __thiscall
xmotion::
Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
::ObtainVertexFromVertexMap
          (Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
           *this,shared_ptr<xmotion::StateExample> *state)

{
  int64_t iVar1;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false>
  _Var2;
  Vertex *this_00;
  VertexMapType *this_01;
  int64_t state_id;
  __shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2> local_40;
  int64_t local_30;
  Vertex *local_28;
  
  std::__shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&state->super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>
            );
  iVar1 = DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>::
          operator()<xmotion::StateExample,_true>
                    ((DefaultIndexer<std::shared_ptr<xmotion::StateExample>_> *)this,
                     (shared_ptr<xmotion::StateExample> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  this_01 = &this->vertex_map_;
  state_id = iVar1;
  _Var2._M_cur = (__node_type *)
                 std::
                 _Hashtable<long,_std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_std::allocator<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&this_01->_M_h,&state_id);
  if (_Var2._M_cur == (__node_type *)0x0) {
    this_00 = (Vertex *)operator_new(0x78);
    std::__shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,
               &state->super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>);
    Vertex::Vertex(this_00,(shared_ptr<xmotion::StateExample> *)&local_50,state_id);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    (this_00->search_parent).super_const_vertex_iterator.super_VertexMapTypeIterator.
    super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false>
    ._M_cur = (__node_type *)0x0;
    local_30 = state_id;
    local_28 = this_00;
    std::
    _Hashtable<long,std::pair<long_const,xmotion::Graph<std::shared_ptr<xmotion::StateExample>,double,xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>>>::Vertex*>,std::allocator<std::pair<long_const,xmotion::Graph<std::shared_ptr<xmotion::StateExample>,double,xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>>>::Vertex*>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<long,xmotion::Graph<std::shared_ptr<xmotion::StateExample>,double,xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>>>::Vertex*>>
              ((_Hashtable<long,std::pair<long_const,xmotion::Graph<std::shared_ptr<xmotion::StateExample>,double,xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>>>::Vertex*>,std::allocator<std::pair<long_const,xmotion::Graph<std::shared_ptr<xmotion::StateExample>,double,xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>>>::Vertex*>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)this_01);
    _Var2._M_cur = (__node_type *)
                   std::
                   _Hashtable<long,_std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_std::allocator<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&this_01->_M_h,&state_id);
  }
  return (vertex_iterator)_Var2._M_cur;
}

Assistant:

typename Graph<State, Transition, StateIndexer>::vertex_iterator
Graph<State, Transition, StateIndexer>::ObtainVertexFromVertexMap(State state) {
  int64_t state_id = GetStateIndex(state);
  auto it = vertex_map_.find(state_id);

  if (it == vertex_map_.end()) {
    auto new_vertex = new Vertex(state, state_id);
    new_vertex->search_parent = vertex_end();
    vertex_map_.insert(std::make_pair(state_id, new_vertex));
    return vertex_iterator(vertex_map_.find(state_id));
  }

  return vertex_iterator(it);
}